

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.cpp
# Opt level: O0

void __thiscall Oric::VideoOutput::run_for(VideoOutput *this,Cycles cycles)

{
  int iVar1;
  uint32_t uVar2;
  byte bVar3;
  byte bVar4;
  IntType IVar5;
  uint8_t *puVar6;
  uint32_t *puVar7;
  int *piVar8;
  int iVar9;
  bool bVar10;
  uint local_60;
  uint32_t local_4c;
  int period;
  uint32_t colours_1 [2];
  uint8_t colours [2];
  uint8_t inverse_mask;
  int line;
  int address;
  uint8_t control_byte;
  uint8_t pixels;
  uint8_t blink_mask;
  int character_base_address;
  int pixel_base_address;
  int columns;
  uint local_20;
  int cycles_run_for;
  int h_counter;
  int number_of_cycles;
  VideoOutput *this_local;
  Cycles cycles_local;
  
  _h_counter = this;
  this_local = (VideoOutput *)cycles.super_WrappedInt<Cycles>.length_;
  IVar5 = WrappedInt<Cycles>::as_integral((WrappedInt<Cycles> *)&this_local);
  for (cycles_run_for = (int)IVar5; cycles_run_for != 0; cycles_run_for = cycles_run_for - columns)
  {
    local_20 = this->counter_ & 0x3f;
    columns = 0;
    if ((this->counter_ < this->v_sync_start_position_) ||
       (this->v_sync_end_position_ <= this->counter_)) {
      if ((this->counter_ < 0x3800) && (local_20 < 0x28)) {
        if (local_20 == 0) {
          this->ink_ = '\a';
          this->paper_ = '\0';
          this->blink_text_ = false;
          this->use_double_height_characters_ = false;
          this->use_alternative_character_set_ = false;
          set_character_set_base_address(this);
          if (this->data_type_ == Red1Green1Blue1) {
            puVar6 = Outputs::CRT::CRT::begin_data(&this->crt_,0xf0,1);
            this->rgb_pixel_target_ = puVar6;
          }
          else {
            puVar7 = (uint32_t *)Outputs::CRT::CRT::begin_data(&this->crt_,0xf0,1);
            this->composite_pixel_target_ = puVar7;
          }
          if (this->counter_ == 0) {
            this->frame_counter_ = this->frame_counter_ + 1;
            iVar9 = 0x4000;
            if ((this->next_frame_is_sixty_hertz_ & 1U) != 0) {
              iVar9 = 0x3a80;
            }
            this->v_sync_start_position_ = iVar9;
            iVar9 = 0x40c0;
            if ((this->next_frame_is_sixty_hertz_ & 1U) != 0) {
              iVar9 = 0x3b80;
            }
            this->v_sync_end_position_ = iVar9;
            iVar9 = 0x4e00;
            if ((this->next_frame_is_sixty_hertz_ & 1U) != 0) {
              iVar9 = 0x4180;
            }
            this->counter_period_ = iVar9;
          }
        }
        pixel_base_address = 0x28 - local_20;
        piVar8 = std::min<int>(&pixel_base_address,&cycles_run_for);
        character_base_address = *piVar8;
        columns = character_base_address;
        iVar9 = this->counter_;
        iVar1 = this->counter_;
        bVar10 = false;
        if ((this->blink_text_ & 1U) != 0) {
          bVar10 = (this->frame_counter_ & 0x20U) != 0;
        }
        bVar3 = 0xff;
        if (bVar10) {
          bVar3 = 0;
        }
        while (character_base_address != 0) {
          if (((this->is_graphics_mode_ & 1U) == 0) || (0x31ff < this->counter_)) {
            line._1_1_ = this->ram_[(int)((iVar1 >> 9) * 0x28 + 48000 + local_20)];
            if ((this->use_double_height_characters_ & 1U) == 0) {
              local_60 = this->counter_ >> 6;
            }
            else {
              local_60 = this->counter_ >> 7;
            }
            local_60 = local_60 & 7;
            colours_1[1] = local_60;
            line._2_1_ = this->ram_
                         [(int)(this->character_set_base_address_ + (line._1_1_ & 0x7f) * 8 +
                               local_60)];
          }
          else {
            line._1_1_ = this->ram_[(int)((iVar9 >> 6) * 0x28 + 0xa000 + local_20)];
            line._2_1_ = line._1_1_;
          }
          colours_1[0]._3_1_ = 0;
          if ((line._1_1_ & 0x80) != 0) {
            colours_1[0]._3_1_ = 7;
          }
          bVar4 = line._2_1_ & bVar3;
          if ((line._1_1_ & 0x60) == 0) {
            switch(line._1_1_ & 0x1f) {
            case 0:
              this->ink_ = '\0';
              break;
            case 1:
              this->ink_ = '\x04';
              break;
            case 2:
              this->ink_ = '\x02';
              break;
            case 3:
              this->ink_ = '\x06';
              break;
            case 4:
              this->ink_ = '\x01';
              break;
            case 5:
              this->ink_ = '\x05';
              break;
            case 6:
              this->ink_ = '\x03';
              break;
            case 7:
              this->ink_ = '\a';
              break;
            case 8:
            case 9:
            case 10:
            case 0xb:
            case 0xc:
            case 0xd:
            case 0xe:
            case 0xf:
              this->use_alternative_character_set_ = (line._1_1_ & 1) != 0;
              this->use_double_height_characters_ = (line._1_1_ & 2) != 0;
              this->blink_text_ = (line._1_1_ & 4) != 0;
              set_character_set_base_address(this);
              break;
            case 0x10:
              this->paper_ = '\0';
              break;
            case 0x11:
              this->paper_ = '\x04';
              break;
            case 0x12:
              this->paper_ = '\x02';
              break;
            case 0x13:
              this->paper_ = '\x06';
              break;
            case 0x14:
              this->paper_ = '\x01';
              break;
            case 0x15:
              this->paper_ = '\x05';
              break;
            case 0x16:
              this->paper_ = '\x03';
              break;
            case 0x17:
              this->paper_ = '\a';
              break;
            case 0x18:
            case 0x19:
            case 0x1a:
            case 0x1b:
            case 0x1c:
            case 0x1d:
            case 0x1e:
            case 0x1f:
              this->is_graphics_mode_ = (line._1_1_ & 4) != 0;
              this->next_frame_is_sixty_hertz_ = (bool)(((line._1_1_ & 2) != 0 ^ 0xffU) & 1);
            }
            if ((this->data_type_ == Red1Green1Blue1) && (this->rgb_pixel_target_ != (uint8_t *)0x0)
               ) {
              bVar4 = this->paper_ ^ colours_1[0]._3_1_;
              this->rgb_pixel_target_[5] = bVar4;
              this->rgb_pixel_target_[4] = bVar4;
              this->rgb_pixel_target_[3] = bVar4;
              this->rgb_pixel_target_[2] = bVar4;
              this->rgb_pixel_target_[1] = bVar4;
              *this->rgb_pixel_target_ = bVar4;
            }
            else if (this->composite_pixel_target_ != (uint32_t *)0x0) {
              uVar2 = this->colour_forms_[(int)(uint)(this->paper_ ^ colours_1[0]._3_1_)];
              this->composite_pixel_target_[5] = uVar2;
              this->composite_pixel_target_[4] = uVar2;
              this->composite_pixel_target_[3] = uVar2;
              this->composite_pixel_target_[2] = uVar2;
              this->composite_pixel_target_[1] = uVar2;
              *this->composite_pixel_target_ = uVar2;
            }
          }
          else if ((this->data_type_ == Red1Green1Blue1) &&
                  (this->rgb_pixel_target_ != (uint8_t *)0x0)) {
            colours_1[0]._1_1_ = this->paper_ ^ colours_1[0]._3_1_;
            colours_1[0]._2_1_ = this->ink_ ^ colours_1[0]._3_1_;
            *this->rgb_pixel_target_ =
                 *(uint8_t *)((long)colours_1 + (long)(int)((int)(uint)bVar4 >> 5 & 1) + 1);
            this->rgb_pixel_target_[1] =
                 *(uint8_t *)((long)colours_1 + (long)(int)((int)(uint)bVar4 >> 4 & 1) + 1);
            this->rgb_pixel_target_[2] =
                 *(uint8_t *)((long)colours_1 + (long)(int)((int)(uint)bVar4 >> 3 & 1) + 1);
            this->rgb_pixel_target_[3] =
                 *(uint8_t *)((long)colours_1 + (long)(int)((int)(uint)bVar4 >> 2 & 1) + 1);
            this->rgb_pixel_target_[4] =
                 *(uint8_t *)((long)colours_1 + (long)(int)((int)(uint)bVar4 >> 1 & 1) + 1);
            this->rgb_pixel_target_[5] = *(uint8_t *)((long)colours_1 + (long)(int)(bVar4 & 1) + 1);
          }
          else if (this->composite_pixel_target_ != (uint32_t *)0x0) {
            local_4c = this->colour_forms_[(int)(uint)(this->paper_ ^ colours_1[0]._3_1_)];
            period = this->colour_forms_[(int)(uint)(this->ink_ ^ colours_1[0]._3_1_)];
            *this->composite_pixel_target_ = (&local_4c)[(int)((int)(uint)bVar4 >> 5 & 1)];
            this->composite_pixel_target_[1] = (&local_4c)[(int)((int)(uint)bVar4 >> 4 & 1)];
            this->composite_pixel_target_[2] = (&local_4c)[(int)((int)(uint)bVar4 >> 3 & 1)];
            this->composite_pixel_target_[3] = (&local_4c)[(int)((int)(uint)bVar4 >> 2 & 1)];
            this->composite_pixel_target_[4] = (&local_4c)[(int)((int)(uint)bVar4 >> 1 & 1)];
            this->composite_pixel_target_[5] = (&local_4c)[(int)(bVar4 & 1)];
          }
          if (this->rgb_pixel_target_ != (uint8_t *)0x0) {
            this->rgb_pixel_target_ = this->rgb_pixel_target_ + 6;
          }
          if (this->composite_pixel_target_ != (uint32_t *)0x0) {
            this->composite_pixel_target_ = this->composite_pixel_target_ + 6;
          }
          local_20 = local_20 + 1;
          character_base_address = character_base_address + -1;
        }
        if (local_20 == 0x28) {
          Outputs::CRT::CRT::output_data(&this->crt_,0xf0);
          this->rgb_pixel_target_ = (uint8_t *)0x0;
          this->composite_pixel_target_ = (uint32_t *)0x0;
        }
      }
      else if (local_20 < 0x30) {
        columns = 0x30 - local_20;
        if (cycles_run_for < columns) {
          columns = cycles_run_for;
        }
        else {
          iVar9 = 0x30;
          if (this->counter_ < 0x3800) {
            iVar9 = 8;
          }
          Outputs::CRT::CRT::output_blank(&this->crt_,iVar9 * 6);
        }
      }
      else if (local_20 < 0x36) {
        columns = 0x36 - local_20;
        if (cycles_run_for < columns) {
          columns = cycles_run_for;
        }
        else {
          Outputs::CRT::CRT::output_sync(&this->crt_,0x24);
        }
      }
      else if (local_20 < 0x38) {
        columns = 0x38 - local_20;
        if (cycles_run_for < columns) {
          columns = cycles_run_for;
        }
        else {
          Outputs::CRT::CRT::output_default_colour_burst(&this->crt_,0xc,')');
        }
      }
      else {
        columns = 0x40 - local_20;
        if (cycles_run_for < columns) {
          columns = cycles_run_for;
        }
        else {
          Outputs::CRT::CRT::output_blank(&this->crt_,0x30);
        }
      }
    }
    else {
      columns = this->v_sync_end_position_ - this->counter_;
      if (cycles_run_for < columns) {
        columns = cycles_run_for;
      }
      else {
        Outputs::CRT::CRT::output_sync
                  (&this->crt_,(this->v_sync_end_position_ - this->v_sync_start_position_) * 6);
      }
    }
    this->counter_ = (this->counter_ + columns) % this->counter_period_;
  }
  return;
}

Assistant:

void VideoOutput::run_for(const Cycles cycles) {
	// Horizontal: 0-39: pixels; otherwise blank; 48-53 sync, 54-56 colour burst.
	// Vertical: 0-223: pixels; otherwise blank; 256-259 (50Hz) or 234-238 (60Hz) sync.

#define clamp(action)	\
	if(cycles_run_for <= number_of_cycles) { action; } else cycles_run_for = number_of_cycles;

	int number_of_cycles = int(cycles.as_integral());
	while(number_of_cycles) {
		int h_counter = counter_ & 63;
		int cycles_run_for = 0;

		if(counter_ >= v_sync_start_position_ && counter_ < v_sync_end_position_) {
			// this is a sync line
			cycles_run_for = v_sync_end_position_ - counter_;
			clamp(crt_.output_sync((v_sync_end_position_ - v_sync_start_position_) * 6));
		} else if(counter_ < 224*64 && h_counter < 40) {
			// this is a pixel line
			if(!h_counter) {
				ink_ = 0x7;
				paper_ = 0x0;
				use_alternative_character_set_ = use_double_height_characters_ = blink_text_ = false;
				set_character_set_base_address();

				if(data_type_ == Outputs::Display::InputDataType::Red1Green1Blue1) {
					rgb_pixel_target_ = reinterpret_cast<uint8_t *>(crt_.begin_data(240));
				} else {
					composite_pixel_target_ = reinterpret_cast<uint32_t *>(crt_.begin_data(240));
				}

				if(!counter_) {
					frame_counter_++;

					v_sync_start_position_ = next_frame_is_sixty_hertz_ ? PAL60VSyncStartPosition : PAL50VSyncStartPosition;
					v_sync_end_position_ = next_frame_is_sixty_hertz_ ? PAL60VSyncEndPosition : PAL50VSyncEndPosition;
					counter_period_ = next_frame_is_sixty_hertz_ ? PAL60Period : PAL50Period;
				}
			}

			cycles_run_for = std::min(40 - h_counter, number_of_cycles);
			int columns = cycles_run_for;
			int pixel_base_address = 0xa000 + (counter_ >> 6) * 40;
			int character_base_address = 0xbb80 + (counter_ >> 9) * 40;
			const uint8_t blink_mask = (blink_text_ && (frame_counter_&32)) ? 0x00 : 0xff;

			while(columns--) {
				uint8_t pixels, control_byte;

				if(is_graphics_mode_ && counter_ < 200*64) {
					control_byte = pixels = ram_[pixel_base_address + h_counter];
				} else {
					int address = character_base_address + h_counter;
					control_byte = ram_[address];
					const int line = use_double_height_characters_ ? ((counter_ >> 7) & 7) : ((counter_ >> 6) & 7);
					pixels = ram_[character_set_base_address_ + (control_byte&127) * 8 + line];
				}

				const uint8_t inverse_mask = (control_byte & 0x80) ? 0x7 : 0x0;
				pixels &= blink_mask;

				if(control_byte & 0x60) {
					if(data_type_ == Outputs::Display::InputDataType::Red1Green1Blue1 && rgb_pixel_target_) {
						const uint8_t colours[2] = {
							uint8_t(paper_ ^ inverse_mask),
							uint8_t(ink_ ^ inverse_mask)
						};
						rgb_pixel_target_[0] = colours[(pixels >> 5)&1];
						rgb_pixel_target_[1] = colours[(pixels >> 4)&1];
						rgb_pixel_target_[2] = colours[(pixels >> 3)&1];
						rgb_pixel_target_[3] = colours[(pixels >> 2)&1];
						rgb_pixel_target_[4] = colours[(pixels >> 1)&1];
						rgb_pixel_target_[5] = colours[(pixels >> 0)&1];
					} else if(composite_pixel_target_) {
						const uint32_t colours[2] = {
							colour_forms_[paper_ ^ inverse_mask],
							colour_forms_[ink_ ^ inverse_mask]
						};
						composite_pixel_target_[0] = colours[(pixels >> 5)&1];
						composite_pixel_target_[1] = colours[(pixels >> 4)&1];
						composite_pixel_target_[2] = colours[(pixels >> 3)&1];
						composite_pixel_target_[3] = colours[(pixels >> 2)&1];
						composite_pixel_target_[4] = colours[(pixels >> 1)&1];
						composite_pixel_target_[5] = colours[(pixels >> 0)&1];
					}
				} else {
					switch(control_byte & 0x1f) {
						case 0x00:		ink_ = 0x0;	break;
						case 0x01:		ink_ = 0x4;	break;
						case 0x02:		ink_ = 0x2;	break;
						case 0x03:		ink_ = 0x6;	break;
						case 0x04:		ink_ = 0x1;	break;
						case 0x05:		ink_ = 0x5;	break;
						case 0x06:		ink_ = 0x3;	break;
						case 0x07:		ink_ = 0x7;	break;

						case 0x08:	case 0x09:	case 0x0a: case 0x0b:
						case 0x0c:	case 0x0d:	case 0x0e: case 0x0f:
							use_alternative_character_set_ = (control_byte&1);
							use_double_height_characters_ = (control_byte&2);
							blink_text_ = (control_byte&4);
							set_character_set_base_address();
						break;

						case 0x10:		paper_ = 0x0;	break;
						case 0x11:		paper_ = 0x4;	break;
						case 0x12:		paper_ = 0x2;	break;
						case 0x13:		paper_ = 0x6;	break;
						case 0x14:		paper_ = 0x1;	break;
						case 0x15:		paper_ = 0x5;	break;
						case 0x16:		paper_ = 0x3;	break;
						case 0x17:		paper_ = 0x7;	break;

						case 0x18: case 0x19: case 0x1a: case 0x1b:
						case 0x1c: case 0x1d: case 0x1e: case 0x1f:
							is_graphics_mode_ = (control_byte & 4);
							next_frame_is_sixty_hertz_ = !(control_byte & 2);
						break;

						default: break;
					}

					if(data_type_ == Outputs::Display::InputDataType::Red1Green1Blue1 && rgb_pixel_target_) {
						rgb_pixel_target_[0] = rgb_pixel_target_[1] =
						rgb_pixel_target_[2] = rgb_pixel_target_[3] =
						rgb_pixel_target_[4] = rgb_pixel_target_[5] = paper_ ^ inverse_mask;
					} else if(composite_pixel_target_) {
						composite_pixel_target_[0] = composite_pixel_target_[1] =
						composite_pixel_target_[2] = composite_pixel_target_[3] =
						composite_pixel_target_[4] = composite_pixel_target_[5] = colour_forms_[paper_ ^ inverse_mask];
					}
				}
				if(rgb_pixel_target_) rgb_pixel_target_ += 6;
				if(composite_pixel_target_) composite_pixel_target_ += 6;
				h_counter++;
			}

			if(h_counter == 40) {
				crt_.output_data(40 * 6);
				rgb_pixel_target_ = nullptr;
				composite_pixel_target_ = nullptr;
			}
		} else {
			// this is a blank line (or the equivalent part of a pixel line)
			if(h_counter < 48) {
				cycles_run_for = 48 - h_counter;
				clamp(
					int period = (counter_ < 224*64) ? 8 : 48;
					crt_.output_blank(period * 6);
				);
			} else if(h_counter < 54) {
				cycles_run_for = 54 - h_counter;
				clamp(crt_.output_sync(6 * 6));
			} else if(h_counter < 56) {
				cycles_run_for = 56 - h_counter;
				clamp(crt_.output_default_colour_burst(2 * 6));
			} else {
				cycles_run_for = 64 - h_counter;
				clamp(crt_.output_blank(8 * 6));
			}
		}

		counter_ = (counter_ + cycles_run_for)%counter_period_;
		number_of_cycles -= cycles_run_for;
	}
}